

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_Burst(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                     VMReturn *ret,int numret)

{
  PClassActor *type;
  int iVar1;
  uint uVar2;
  AActor *pAVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  bool local_92;
  bool local_8f;
  TFlags<ActorFlag4,_unsigned_int> local_8c;
  DVector3 local_88;
  double local_70;
  double zo;
  double yo;
  double xo;
  AActor *mo;
  int numChunks;
  int i;
  MetaClass *chunk;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  TArray<VMValue,_VMValue> *pTStack_20;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pTStack_20 = defaultparam;
  defaultparam_local = (TArray<VMValue,_VMValue> *)param;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe95,"int AF_AActor_A_Burst(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar4 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar4 = true, (param->field_0).field_1.atag != 1)) {
    bVar4 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar4) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe95,"int AF_AActor_A_Burst(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  chunk = (MetaClass *)(param->field_0).field_1.a;
  local_8f = true;
  if (chunk != (MetaClass *)0x0) {
    local_8f = DObject::IsKindOf((DObject *)chunk,AActor::RegistrationInfo.MyClass);
  }
  if (local_8f == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe95,"int AF_AActor_A_Burst(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  self._0_4_ = (int)self + 1;
  if (ret_local._4_4_ <= (int)self) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe96,"int AF_AActor_A_Burst(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar4 = false;
  if (((char)defaultparam_local[(int)self].Count == '\x03') &&
     (bVar4 = true, defaultparam_local[(int)self].Most != 1)) {
    bVar4 = defaultparam_local[(int)self].Array == (VMValue *)0x0;
  }
  if (bVar4) {
    _numChunks = (PClassActor *)defaultparam_local[(int)self].Array;
    local_92 = true;
    if (_numChunks != (PClassActor *)0x0) {
      local_92 = PClass::IsDescendantOf((PClass *)_numChunks,AActor::RegistrationInfo.MyClass);
    }
    if (local_92 != false) {
      if (_numChunks != (PClassActor *)0x0) {
        TVector3<double>::Zero((TVector3<double> *)&(chunk->super_PClass).SpecialInits.Most);
        pAVar3 = AActor::GetDefault((AActor *)chunk);
        *(double *)&chunk->BloodColor = pAVar3->Height;
        mo._0_4_ = MAX<int>(4,(int)(chunk->BurnHeight * *(double *)&chunk->BloodColor) / 0x20);
        iVar1 = FRandom::Random2(&pr_burst);
        mo._4_4_ = iVar1 % ((int)mo / 4);
        for (mo._4_4_ = MAX<int>(0x18,(int)mo + mo._4_4_); -1 < mo._4_4_; mo._4_4_ = mo._4_4_ + -1)
        {
          iVar1 = FRandom::operator()(&pr_burst);
          yo = ((double)(iVar1 + -0x80) * chunk->BurnHeight) / 128.0;
          iVar1 = FRandom::operator()(&pr_burst);
          zo = ((double)(iVar1 + -0x80) * chunk->BurnHeight) / 128.0;
          iVar1 = FRandom::operator()(&pr_burst);
          type = _numChunks;
          local_70 = ((double)iVar1 * *(double *)&chunk->BloodColor) / 255.0;
          AActor::Vec3Offset(&local_88,(AActor *)chunk,yo,zo,local_70,false);
          xo = (double)Spawn(type,&local_88,ALLOW_REPLACE);
          if ((AActor *)xo != (AActor *)0x0) {
            dVar5 = AActor::Z((AActor *)xo);
            dVar6 = AActor::Z((AActor *)chunk);
            *(double *)((long)xo + 0xd8) = ((dVar5 - dVar6) * 4.0) / *(double *)&chunk->BloodColor;
            iVar1 = FRandom::Random2(&pr_burst);
            *(double *)((long)xo + 200) = (double)iVar1 / 128.0;
            iVar1 = FRandom::Random2(&pr_burst);
            *(double *)((long)xo + 0xd0) = (double)iVar1 / 128.0;
            *(undefined4 *)((long)xo + 0x108) =
                 *(undefined4 *)&(chunk->super_PClass).ConstructNative;
            *(PClassActor **)((long)xo + 0x118) = chunk->Replacement;
            AActor::CopyFriendliness((AActor *)xo,(AActor *)chunk,true,true);
          }
        }
        TFlags<ActorFlag4,_unsigned_int>::operator&
                  (&local_8c,
                   (int)chunk +
                   (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH));
        uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_8c);
        if (uVar2 != 0) {
          A_BossDeath((AActor *)chunk);
        }
        A_Unblock((AActor *)chunk,true);
        (**(code **)(*(long *)&(chunk->super_PClass).super_PNativeStruct.super_PStruct.
                               super_PNamedType.super_PCompoundType.super_PType.super_PTypeBase +
                    0x20))();
      }
      return 0;
    }
    __assert_fail("chunk == NULL || chunk->IsDescendantOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe96,"int AF_AActor_A_Burst(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xe96,"int AF_AActor_A_Burst(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Burst)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS(chunk, AActor);

	int i, numChunks;
	AActor * mo;

	if (chunk == NULL)
	{
		return 0;
	}

	self->Vel.Zero();
	self->Height = self->GetDefault()->Height;

	// [RH] In Hexen, this creates a random number of shards (range [24,56])
	// with no relation to the size of the self shattering. I think it should
	// base the number of shards on the size of the dead thing, so bigger
	// things break up into more shards than smaller things.
	// An self with radius 20 and height 64 creates ~40 chunks.
	numChunks = MAX<int> (4, int(self->radius * self->Height)/32);
	i = (pr_burst.Random2()) % (numChunks/4);
	for (i = MAX (24, numChunks + i); i >= 0; i--)
	{
		double xo = (pr_burst() - 128) * self->radius / 128;
		double yo = (pr_burst() - 128) * self->radius / 128;
		double zo = (pr_burst() * self->Height / 255);
		mo = Spawn(chunk, self->Vec3Offset(xo, yo, zo), ALLOW_REPLACE);

		if (mo)
		{
			mo->Vel.Z = 4 * (mo->Z() - self->Z()) / self->Height;
			mo->Vel.X = pr_burst.Random2() / 128.;
			mo->Vel.Y = pr_burst.Random2() / 128.;
			mo->RenderStyle = self->RenderStyle;
			mo->Alpha = self->Alpha;
			mo->CopyFriendliness(self, true);
		}
	}

	// [RH] Do some stuff to make this more useful outside Hexen
	if (self->flags4 & MF4_BOSSDEATH)
	{
		A_BossDeath(self);
	}
	A_Unblock(self, true);

	self->Destroy ();
	return 0;
}